

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O2

path * __thiscall ghc::filesystem::path::filename(path *__return_storage_ptr__,path *this)

{
  bool bVar1;
  iterator *piVar2;
  undefined1 local_60 [72];
  
  bVar1 = has_relative_path(this);
  if (bVar1) {
    end((iterator *)local_60,this);
    piVar2 = iterator::operator--((iterator *)local_60);
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&piVar2->_current);
    std::__cxx11::string::~string((string *)(local_60 + 0x28));
  }
  else {
    (__return_storage_ptr__->_path)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->_path).field_2;
    (__return_storage_ptr__->_path)._M_string_length = 0;
    (__return_storage_ptr__->_path).field_2._M_local_buf[0] = '\0';
  }
  return __return_storage_ptr__;
}

Assistant:

GHC_INLINE path path::filename() const
{
    return !has_relative_path() ? path() : path(*--end());
}